

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O0

Curl_addrinfo * Curl_doh(connectdata *conn,char *hostname,int port,int *waitp)

{
  Curl_easy *data_00;
  CURLcode CVar1;
  curl_slist *pcVar2;
  CURLcode result;
  Curl_easy *data;
  int *waitp_local;
  int port_local;
  char *hostname_local;
  connectdata *conn_local;
  
  data_00 = conn->data;
  *waitp = 1;
  memset(&(data_00->req).doh,0,0x470);
  (data_00->req).doh.host = hostname;
  (data_00->req).doh.port = port;
  pcVar2 = curl_slist_append((curl_slist *)0x0,"Content-Type: application/dns-message");
  (data_00->req).doh.headers = pcVar2;
  if ((data_00->req).doh.headers != (curl_slist *)0x0) {
    if (conn->ip_version != 2) {
      CVar1 = dohprobe(data_00,(data_00->req).doh.probe,DNS_TYPE_A,hostname,(data_00->set).str[0x3b]
                       ,data_00->multi,(data_00->req).doh.headers);
      if (CVar1 != CURLE_OK) goto LAB_007f7dd4;
      (data_00->req).doh.pending = (data_00->req).doh.pending + 1;
    }
    if (conn->ip_version == 1) {
      return (Curl_addrinfo *)0x0;
    }
    CVar1 = dohprobe(data_00,(data_00->req).doh.probe + 1,DNS_TYPE_AAAA,hostname,
                     (data_00->set).str[0x3b],data_00->multi,(data_00->req).doh.headers);
    if (CVar1 == CURLE_OK) {
      (data_00->req).doh.pending = (data_00->req).doh.pending + 1;
      return (Curl_addrinfo *)0x0;
    }
  }
LAB_007f7dd4:
  curl_slist_free_all((data_00->req).doh.headers);
  (data_00->req).doh.headers = (curl_slist *)0x0;
  curl_easy_cleanup((data_00->req).doh.probe[0].easy);
  (data_00->req).doh.probe[0].easy = (CURL_conflict *)0x0;
  curl_easy_cleanup((data_00->req).doh.probe[1].easy);
  (data_00->req).doh.probe[1].easy = (CURL_conflict *)0x0;
  return (Curl_addrinfo *)0x0;
}

Assistant:

Curl_addrinfo *Curl_doh(struct connectdata *conn,
                        const char *hostname,
                        int port,
                        int *waitp)
{
  struct Curl_easy *data = conn->data;
  CURLcode result = CURLE_OK;
  *waitp = TRUE; /* this never returns synchronously */
  (void)conn;
  (void)hostname;
  (void)port;

  /* start clean, consider allocating this struct on demand */
  memset(&data->req.doh, 0, sizeof(struct dohdata));

  data->req.doh.host = hostname;
  data->req.doh.port = port;
  data->req.doh.headers =
    curl_slist_append(NULL,
                      "Content-Type: application/dns-message");
  if(!data->req.doh.headers)
    goto error;

  if(conn->ip_version != CURL_IPRESOLVE_V6) {
    /* create IPv4 DOH request */
    result = dohprobe(data, &data->req.doh.probe[0], DNS_TYPE_A,
                      hostname, data->set.str[STRING_DOH],
                      data->multi, data->req.doh.headers);
    if(result)
      goto error;
    data->req.doh.pending++;
  }

  if(conn->ip_version != CURL_IPRESOLVE_V4) {
    /* create IPv6 DOH request */
    result = dohprobe(data, &data->req.doh.probe[1], DNS_TYPE_AAAA,
                      hostname, data->set.str[STRING_DOH],
                      data->multi, data->req.doh.headers);
    if(result)
      goto error;
    data->req.doh.pending++;
  }
  return NULL;

  error:
  curl_slist_free_all(data->req.doh.headers);
  data->req.doh.headers = NULL;
  curl_easy_cleanup(data->req.doh.probe[0].easy);
  data->req.doh.probe[0].easy = NULL;
  curl_easy_cleanup(data->req.doh.probe[1].easy);
  data->req.doh.probe[1].easy = NULL;
  return NULL;
}